

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ushort uVar4;
  int iVar5;
  TcParseTableBase *pTVar6;
  bool bVar7;
  uint uVar8;
  MessageLite *pMVar9;
  ulong uVar10;
  char *pcVar11;
  string *psVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  undefined8 uVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar15;
  int iVar16;
  long lVar17;
  RepeatedPtrFieldBase *ptr_00;
  uint *puVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  RepeatedPtrFieldBase local_68;
  RepeatedPtrFieldBase *local_50;
  TcParseTableBase *local_48;
  TcParseTableBase *local_40;
  long local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  local_50 = (RepeatedPtrFieldBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30))
  ;
  if (((ulong)local_50 & 7) != 0) {
    AlignFail(local_50);
  }
  uVar4 = *(ushort *)ptr;
  local_40 = MessageLite::GetTcParseTable
                       (*(MessageLite **)
                         ((long)&table->has_bits_offset +
                         ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  local_68.arena_._0_4_ = (uint)uVar4;
  aVar13._0_4_ = (int)(char)uVar4 + (uint)local_68.arena_ >> 1;
  aVar13.data._4_4_ = 0;
  local_48 = local_40 + 1;
  local_68.arena_._4_4_ = aVar13._0_4_;
  do {
    ptr_00 = local_50;
    pMVar9 = AddMessage(local_40,local_50);
    pTVar6 = local_48;
    auVar21._8_8_ = extraout_RDX;
    auVar21._0_8_ = local_68.tagged_rep_or_elem_;
    iVar5 = ctx->depth_;
    lVar1 = (long)iVar5 + -1;
    iVar20 = (int)lVar1;
    ctx->depth_ = iVar20;
    if ((long)iVar5 < 1) {
LAB_0028d94e:
      local_68.tagged_rep_or_elem_ = auVar21._0_8_;
      pcVar11 = Error(msg,(char *)ptr_00,auVar21._8_8_,(TcFieldData)aVar13,table,hasbits);
      return pcVar11;
    }
    local_38 = (long)ctx->group_depth_;
    lVar17 = local_38 + 1;
    iVar16 = (int)lVar17;
    ctx->group_depth_ = iVar16;
    local_68.tagged_rep_or_elem_ =
         (RepeatedPtrFieldBase *)((long)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ + 2);
    while( true ) {
      ptr_00 = &local_68;
      bVar7 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)ptr_00,ctx->group_depth_);
      auVar21._8_8_ = extraout_RDX_00;
      auVar21._0_8_ = local_68.tagged_rep_or_elem_;
      if (bVar7) break;
      uVar8 = (uint)pTVar6[-1].fast_idx_mask &
              (uint)*(ushort *)(void **)local_68.tagged_rep_or_elem_;
      if ((uVar8 & 7) != 0) goto LAB_0028da6b;
      uVar10 = (ulong)(uVar8 & 0xfffffff8);
      aVar13.data = (ulong)*(ushort *)(void **)local_68.tagged_rep_or_elem_ ^
                    *(ulong *)(&pTVar6->fast_idx_mask + uVar10 * 2);
      auVar21 = (**(code **)(&pTVar6->has_bits_offset + uVar10))
                          (pMVar9,local_68.tagged_rep_or_elem_,ctx,aVar13.data,pTVar6 + -1,0);
      ptr_00 = (RepeatedPtrFieldBase *)local_68.tagged_rep_or_elem_;
      if ((auVar21._0_8_ == (RepeatedPtrFieldBase *)0x0) ||
         (local_68.tagged_rep_or_elem_ = auVar21._0_8_,
         (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_68.tagged_rep_or_elem_ = auVar21._0_8_;
    ptr = (char *)local_68.tagged_rep_or_elem_;
    if ((pTVar6[-1].field_0x9 & 1) != 0) {
      ptr_00 = (RepeatedPtrFieldBase *)local_68.tagged_rep_or_elem_;
      auVar22 = (undefined1  [16])
                (*pTVar6[-1].post_loop_handler)(pMVar9,(char *)local_68.tagged_rep_or_elem_,ctx);
      auVar21._8_8_ = auVar22._8_8_;
      auVar21._0_8_ = local_68.tagged_rep_or_elem_;
      ptr = (char *)auVar22._0_8_;
    }
    local_68.tagged_rep_or_elem_ = auVar21._0_8_;
    if ((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) {
      uVar2 = ctx->depth_;
      uVar3 = ctx->group_depth_;
      ctx->depth_ = uVar2 + 1;
      ctx->group_depth_ = uVar3 + -1;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      goto LAB_0028d94e;
    }
    if (iVar20 != ctx->depth_) {
      psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (lVar1,(long)ctx->depth_,"old_depth == depth_");
      uVar19 = *(undefined8 *)psVar12;
      uVar14 = *(undefined8 *)(psVar12 + 8);
      uVar15 = 0x45b;
LAB_0028da07:
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,uVar15,uVar14,uVar19);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    }
    ptr_00 = (RepeatedPtrFieldBase *)(long)ctx->group_depth_;
    if (iVar16 != ctx->group_depth_) {
      psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (lVar17,(long)ptr_00,"old_group_depth == group_depth_");
      uVar19 = *(undefined8 *)psVar12;
      uVar14 = *(undefined8 *)(psVar12 + 8);
      uVar15 = 0x45c;
      goto LAB_0028da07;
    }
    ctx->group_depth_ = (int)local_38;
    ctx->depth_ = iVar5;
    uVar8 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    if (((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) ||
       (uVar8 != local_68.arena_._4_4_)) goto LAB_0028d94e;
    if ((RepeatedPtrFieldBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar18 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar18 & 3) != 0) {
          AlignFail();
        }
        *puVar18 = *puVar18 | (uint)hasbits;
      }
      return (char *)(RepeatedPtrFieldBase *)ptr;
    }
    uVar4 = *(ushort *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
    aVar13.data._2_6_ = 0;
    aVar13.data._0_2_ = uVar4;
    if (uVar4 != (ushort)local_68.arena_) {
      uVar8 = (uint)table->fast_idx_mask & (uint)uVar4;
      if ((uVar8 & 7) == 0) {
        uVar10 = (ulong)(uVar8 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar10))
                                    (msg,ptr,ctx,
                                     aVar13.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar10 * 2),
                                     table,hasbits);
        return pcVar11;
      }
LAB_0028da6b:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}